

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *directory,FilePath *base_name,int number,char *extension)

{
  int in_ECX;
  FilePath *in_RDX;
  FilePath *in_RDI;
  string file;
  char *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [8];
  FilePath *in_stack_ffffffffffffff10;
  FilePath *in_stack_ffffffffffffff18;
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [44];
  int local_1c;
  FilePath *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_48);
  if (local_1c == 0) {
    in_stack_fffffffffffffe90 = string_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_RDI);
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  else {
    in_stack_fffffffffffffe88 = string_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffea8,(char *)in_RDI);
    StreamableToString<int>((int *)in_stack_fffffffffffffea8);
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::operator=(local_48,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_118);
  }
  FilePath((FilePath *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ConcatPaths(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  ~FilePath((FilePath *)0x183bc9);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}